

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

bool __thiscall Catch::TestSpecParser::separate(TestSpecParser *this)

{
  pointer pcVar1;
  Mode MVar2;
  
  MVar2 = this->m_mode & ~Name;
  if (MVar2 == QuotedName) {
    this->m_mode = None;
    pcVar1 = (this->m_substring)._M_dataplus._M_p;
    this->m_pos = (this->m_arg)._M_string_length;
    (this->m_substring)._M_string_length = 0;
    *pcVar1 = '\0';
    (this->m_patternName)._M_string_length = 0;
    *(this->m_patternName)._M_dataplus._M_p = '\0';
    this->m_realPatternPos = 0;
  }
  else {
    endMode(this);
    addFilter(this);
  }
  return MVar2 != QuotedName;
}

Assistant:

bool TestSpecParser::separate() {
      if( (m_mode==QuotedName) || (m_mode==Tag) ){
         //invalid argument, signal failure to previous scope.
         m_mode = None;
         m_pos = m_arg.size();
         m_substring.clear();
         m_patternName.clear();
         m_realPatternPos = 0;
         return false;
      }
      endMode();
      addFilter();
      return true; //success
    }